

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  pointer puVar1;
  byte bVar2;
  ulong uVar3;
  Sequence *pSVar4;
  pointer ppEVar5;
  AlignmentEngine *this;
  int32_t iVar6;
  pointer puVar7;
  pointer ppNVar8;
  int32_t iVar9;
  bool bVar10;
  bool bVar11;
  const_reference cVar12;
  bool bVar13;
  int iVar14;
  int iVar15;
  int iVar16;
  int iVar17;
  unique_ptr<biosoup::Sequence,_std::default_delete<biosoup::Sequence>_> *it;
  pointer puVar18;
  byte *pbVar19;
  ulong uVar20;
  ostream *poVar21;
  Node *pNVar22;
  string *suff;
  string *suff_00;
  string *suff_01;
  string *suff_02;
  string *suff_03;
  string *suff_04;
  string *suff_05;
  string *suff_06;
  string *suff_07;
  string *suff_08;
  string *suff_09;
  string *suff_10;
  uint uVar23;
  unique_ptr<biosoup::Sequence,_std::default_delete<biosoup::Sequence>_> *it_1;
  pointer puVar24;
  pointer ppNVar25;
  pointer puVar26;
  int iVar27;
  char *pcVar28;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_00;
  uint uVar29;
  Edge **jt;
  pointer ppEVar30;
  initializer_list<unsigned_char> __l;
  reference rVar31;
  int local_2b4;
  int8_t local_2b0;
  int8_t local_2a8;
  undefined1 local_2a0 [16];
  allocator<char> local_290;
  allocator<char> local_28f;
  allocator<char> local_28e;
  allocator<char> local_28d;
  allocator<char> local_28c;
  allocator<char> local_28b;
  allocator<char> local_28a;
  allocator<char> local_289;
  Alignment alignment_rev;
  Alignment alignment;
  int32_t local_238;
  int local_234;
  AlignmentType local_230;
  int local_22c;
  int8_t local_228;
  string local_220;
  vector<bool,_std::allocator<bool>_> is_reversed;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  headers;
  vector<std::unique_ptr<biosoup::Sequence,_std::default_delete<biosoup::Sequence>_>,_std::allocator<std::unique_ptr<biosoup::Sequence,_std::default_delete<biosoup::Sequence>_>_>_>
  sequences;
  vector<unsigned_char,_std::allocator<unsigned_char>_> results;
  int32_t score;
  Graph graph;
  int32_t score_rev;
  string dot_path;
  string optstr;
  string local_50;
  
  graph.num_codes_ = graph.num_codes_ & 0xffffff00;
  __l._M_len = 1;
  __l._M_array = (iterator)&graph;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (&results,__l,(allocator_type *)&alignment);
  dot_path._M_dataplus._M_p = (pointer)&dot_path.field_2;
  dot_path._M_string_length = 0;
  dot_path.field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&optstr,"m:n:g:e:q:c:l:r:d:sh",(allocator<char> *)&graph);
  iVar15 = 5;
  iVar17 = 0xf8;
  iVar16 = 0xfa;
  local_2b4 = 0xf6;
  local_22c = 0xfc;
  local_238 = -1;
  local_230 = kSW;
  local_234 = 0xfc;
  iVar27 = 1;
  bVar11 = false;
  do {
    bVar10 = bVar11;
    iVar14 = getopt_long(argc,argv,optstr._M_dataplus._M_p,(anonymous_namespace)::options,0);
    bVar11 = true;
    switch(iVar14) {
    case 99:
      local_22c = atoi(_optarg);
      bVar11 = bVar10;
      break;
    case 100:
      std::__cxx11::string::assign((char *)&dot_path);
      bVar11 = bVar10;
      break;
    case 0x65:
      iVar16 = atoi(_optarg);
      bVar11 = bVar10;
      break;
    case 0x67:
      iVar17 = atoi(_optarg);
      bVar11 = bVar10;
      break;
    case 0x68:
      iVar27 = 0;
      anon_unknown.dwarf_f297::Help();
    case 0x66:
    case 0x69:
    case 0x6a:
    case 0x6b:
    case 0x6f:
    case 0x70:
    case 0x74:
    case 0x75:
switchD_001035fe_caseD_66:
      std::__cxx11::string::~string((string *)&optstr);
      std::__cxx11::string::~string((string *)&dot_path);
      std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                (&results.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
      return iVar27;
    case 0x6c:
      local_230 = atoi(_optarg);
      bVar11 = bVar10;
      break;
    case 0x6d:
      iVar15 = atoi(_optarg);
      bVar11 = bVar10;
      break;
    case 0x6e:
      local_234 = atoi(_optarg);
      bVar11 = bVar10;
      break;
    case 0x71:
      local_2b4 = atoi(_optarg);
      bVar11 = bVar10;
      break;
    case 0x72:
      graph.num_codes_ = atoi(_optarg);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<int>
                (&results,(int *)&graph);
      bVar11 = bVar10;
      break;
    case 0x73:
      break;
    case 0x76:
      spoa::Version_abi_cxx11_();
      poVar21 = std::operator<<((ostream *)&std::cout,(string *)&graph);
      std::endl<char,std::char_traits<char>>(poVar21);
      std::__cxx11::string::~string((string *)&graph);
      iVar27 = 0;
      goto switchD_001035fe_caseD_66;
    default:
      if (iVar14 != 0x4d) {
        if (iVar14 == -1) {
          if (1 < (ulong)((long)results.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_finish -
                         (long)results.
                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                               _M_impl.super__Vector_impl_data._M_start)) {
            puVar1 = results.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_start + 1;
            if (puVar1 != results.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                          _M_impl.super__Vector_impl_data._M_finish) {
              memmove(results.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_start,puVar1,
                      (long)results.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_finish - (long)puVar1);
            }
            results.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_finish =
                 results.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_finish + -1;
          }
          if (_optind < argc) {
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_220,argv[_optind],(allocator<char> *)(local_2a0 + 0xf));
            std::__cxx11::string::string<std::allocator<char>>((string *)&graph,".fasta",&local_289)
            ;
            bVar11 = anon_unknown.dwarf_f297::CreateParser::anon_class_1_0_00000001::operator()
                               ((anon_class_1_0_00000001 *)&local_220,(string *)&graph,suff);
            if (bVar11) {
LAB_00103869:
              std::__cxx11::string::~string((string *)&graph);
LAB_00103876:
              bioparser::Parser<biosoup::Sequence>::Create<bioparser::FastaParser>
                        ((Parser<biosoup::Sequence> *)local_2a0,&local_220);
            }
            else {
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&alignment,".fasta.gz",&local_28a);
              bVar11 = anon_unknown.dwarf_f297::CreateParser::anon_class_1_0_00000001::operator()
                                 ((anon_class_1_0_00000001 *)&local_220,(string *)&alignment,suff_00
                                 );
              if (bVar11) {
LAB_0010385f:
                std::__cxx11::string::~string((string *)&alignment);
                goto LAB_00103869;
              }
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&is_reversed,".fna",&local_28b);
              bVar11 = anon_unknown.dwarf_f297::CreateParser::anon_class_1_0_00000001::operator()
                                 ((anon_class_1_0_00000001 *)&local_220,(string *)&is_reversed,
                                  suff_01);
              if (bVar11) {
                std::__cxx11::string::~string((string *)&is_reversed);
                goto LAB_0010385f;
              }
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&alignment_rev,".fna.gz",&local_28c);
              bVar11 = anon_unknown.dwarf_f297::CreateParser::anon_class_1_0_00000001::operator()
                                 ((anon_class_1_0_00000001 *)&local_220,(string *)&alignment_rev,
                                  suff_02);
              bVar13 = true;
              if (!bVar11) {
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&sequences,".faa",&local_28d);
                bVar11 = anon_unknown.dwarf_f297::CreateParser::anon_class_1_0_00000001::operator()
                                   ((anon_class_1_0_00000001 *)&local_220,(string *)&sequences,
                                    suff_03);
                bVar13 = true;
                if (!bVar11) {
                  std::__cxx11::string::string<std::allocator<char>>
                            ((string *)&headers,".faa.gz",&local_28e);
                  bVar11 = anon_unknown.dwarf_f297::CreateParser::anon_class_1_0_00000001::
                           operator()((anon_class_1_0_00000001 *)&local_220,(string *)&headers,
                                      suff_04);
                  bVar13 = true;
                  if (!bVar11) {
                    std::__cxx11::string::string<std::allocator<char>>
                              ((string *)&score,".fa",&local_28f);
                    bVar11 = anon_unknown.dwarf_f297::CreateParser::anon_class_1_0_00000001::
                             operator()((anon_class_1_0_00000001 *)&local_220,(string *)&score,
                                        suff_05);
                    bVar13 = true;
                    if (!bVar11) {
                      std::__cxx11::string::string<std::allocator<char>>
                                ((string *)&score_rev,".fa.gz",&local_290);
                      bVar13 = anon_unknown.dwarf_f297::CreateParser::anon_class_1_0_00000001::
                               operator()((anon_class_1_0_00000001 *)&local_220,(string *)&score_rev
                                          ,suff_06);
                      std::__cxx11::string::~string((string *)&score_rev);
                    }
                    std::__cxx11::string::~string((string *)&score);
                  }
                  std::__cxx11::string::~string((string *)&headers);
                }
                std::__cxx11::string::~string((string *)&sequences);
              }
              std::__cxx11::string::~string((string *)&alignment_rev);
              std::__cxx11::string::~string((string *)&is_reversed);
              std::__cxx11::string::~string((string *)&alignment);
              std::__cxx11::string::~string((string *)&graph);
              if (bVar13 != false) goto LAB_00103876;
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&graph,".fastq",(allocator<char> *)&sequences);
              bVar11 = anon_unknown.dwarf_f297::CreateParser::anon_class_1_0_00000001::operator()
                                 ((anon_class_1_0_00000001 *)&local_220,(string *)&graph,suff_07);
              if (bVar11) {
LAB_00104569:
                std::__cxx11::string::~string((string *)&graph);
LAB_00104576:
                bioparser::Parser<biosoup::Sequence>::Create<bioparser::FastqParser>
                          ((Parser<biosoup::Sequence> *)local_2a0,&local_220);
              }
              else {
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&alignment,".fastq.gz",(allocator<char> *)&headers);
                bVar11 = anon_unknown.dwarf_f297::CreateParser::anon_class_1_0_00000001::operator()
                                   ((anon_class_1_0_00000001 *)&local_220,(string *)&alignment,
                                    suff_08);
                if (bVar11) {
LAB_0010455f:
                  std::__cxx11::string::~string((string *)&alignment);
                  goto LAB_00104569;
                }
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&is_reversed,".fq",(allocator<char> *)&score);
                bVar11 = anon_unknown.dwarf_f297::CreateParser::anon_class_1_0_00000001::operator()
                                   ((anon_class_1_0_00000001 *)&local_220,(string *)&is_reversed,
                                    suff_09);
                if (bVar11) {
                  std::__cxx11::string::~string((string *)&is_reversed);
                  goto LAB_0010455f;
                }
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&alignment_rev,".fq.gz",(allocator<char> *)&score_rev);
                bVar11 = anon_unknown.dwarf_f297::CreateParser::anon_class_1_0_00000001::operator()
                                   ((anon_class_1_0_00000001 *)&local_220,(string *)&alignment_rev,
                                    suff_10);
                std::__cxx11::string::~string((string *)&alignment_rev);
                std::__cxx11::string::~string((string *)&is_reversed);
                std::__cxx11::string::~string((string *)&alignment);
                std::__cxx11::string::~string((string *)&graph);
                if (bVar11) goto LAB_00104576;
                poVar21 = std::operator<<((ostream *)&std::cerr,"[spoa::CreateParser] error: file ")
                ;
                poVar21 = std::operator<<(poVar21,(string *)&local_220);
                poVar21 = std::operator<<(poVar21,
                                          " has unsupported format extension (valid extensions: .fasta, "
                                         );
                poVar21 = std::operator<<(poVar21,
                                          ".fasta.gz, .fna, .fna.gz, .faa, .faa.gz, .fa, .fa.gz, .fastq, "
                                         );
                poVar21 = std::operator<<(poVar21,".fastq.gz, .fq, .fq.gz)");
                std::endl<char,std::char_traits<char>>(poVar21);
                local_2a0._0_8_ = (_func_int **)0x0;
              }
            }
            std::__cxx11::string::~string((string *)&local_220);
            if ((_func_int **)local_2a0._0_8_ == (_func_int **)0x0) {
              iVar27 = 1;
            }
            else {
              local_228 = (int8_t)iVar15;
              local_2b0 = (int8_t)iVar17;
              local_2a8 = (int8_t)iVar16;
              spoa::AlignmentEngine::Create
                        ((AlignmentEngine *)&graph,local_230 & 0xff,local_228,(int8_t)local_234,
                         local_2b0,local_2a8,(int8_t)local_2b4,(int8_t)local_22c);
              sequences.
              super__Vector_base<std::unique_ptr<biosoup::Sequence,_std::default_delete<biosoup::Sequence>_>,_std::allocator<std::unique_ptr<biosoup::Sequence,_std::default_delete<biosoup::Sequence>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
              this = (AlignmentEngine *)CONCAT44(graph._4_4_,graph.num_codes_);
              sequences.
              super__Vector_base<std::unique_ptr<biosoup::Sequence,_std::default_delete<biosoup::Sequence>_>,_std::allocator<std::unique_ptr<biosoup::Sequence,_std::default_delete<biosoup::Sequence>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
              sequences.
              super__Vector_base<std::unique_ptr<biosoup::Sequence,_std::default_delete<biosoup::Sequence>_>,_std::allocator<std::unique_ptr<biosoup::Sequence,_std::default_delete<biosoup::Sequence>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
              (**(code **)(*(_func_int **)local_2a0._0_8_ + 0x10))
                        (&graph,local_2a0._0_8_,0xffffffffffffffff,1);
              std::
              vector<std::unique_ptr<biosoup::Sequence,_std::default_delete<biosoup::Sequence>_>,_std::allocator<std::unique_ptr<biosoup::Sequence,_std::default_delete<biosoup::Sequence>_>_>_>
              ::_M_move_assign(&sequences);
              std::
              vector<std::unique_ptr<biosoup::Sequence,_std::default_delete<biosoup::Sequence>_>,_std::allocator<std::unique_ptr<biosoup::Sequence,_std::default_delete<biosoup::Sequence>_>_>_>
              ::~vector((vector<std::unique_ptr<biosoup::Sequence,_std::default_delete<biosoup::Sequence>_>,_std::allocator<std::unique_ptr<biosoup::Sequence,_std::default_delete<biosoup::Sequence>_>_>_>
                         *)&graph);
              uVar20 = 0;
              for (puVar18 = sequences.
                             super__Vector_base<std::unique_ptr<biosoup::Sequence,_std::default_delete<biosoup::Sequence>_>,_std::allocator<std::unique_ptr<biosoup::Sequence,_std::default_delete<biosoup::Sequence>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start;
                  puVar18 !=
                  sequences.
                  super__Vector_base<std::unique_ptr<biosoup::Sequence,_std::default_delete<biosoup::Sequence>_>,_std::allocator<std::unique_ptr<biosoup::Sequence,_std::default_delete<biosoup::Sequence>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish; puVar18 = puVar18 + 1) {
                uVar3 = (((puVar18->_M_t).
                          super___uniq_ptr_impl<biosoup::Sequence,_std::default_delete<biosoup::Sequence>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_biosoup::Sequence_*,_std::default_delete<biosoup::Sequence>_>
                          .super__Head_base<0UL,_biosoup::Sequence_*,_false>._M_head_impl)->data).
                        _M_string_length;
                if (uVar20 <= uVar3) {
                  uVar20 = uVar3;
                }
              }
              (*this->_vptr_AlignmentEngine[2])(this,uVar20,4);
              spoa::Graph::Graph(&graph);
              puVar18 = sequences.
                        super__Vector_base<std::unique_ptr<biosoup::Sequence,_std::default_delete<biosoup::Sequence>_>,_std::allocator<std::unique_ptr<biosoup::Sequence,_std::default_delete<biosoup::Sequence>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish;
              is_reversed.super__Bvector_base<std::allocator<bool>_>._M_impl.
              super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
              is_reversed.super__Bvector_base<std::allocator<bool>_>._M_impl.
              super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_offset = 0;
              is_reversed.super__Bvector_base<std::allocator<bool>_>._M_impl.
              super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
              is_reversed.super__Bvector_base<std::allocator<bool>_>._M_impl.
              super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset = 0;
              is_reversed.super__Bvector_base<std::allocator<bool>_>._M_impl.
              super__Bvector_impl_data._M_end_of_storage = (_Bit_pointer)0x0;
              for (puVar24 = sequences.
                             super__Vector_base<std::unique_ptr<biosoup::Sequence,_std::default_delete<biosoup::Sequence>_>,_std::allocator<std::unique_ptr<biosoup::Sequence,_std::default_delete<biosoup::Sequence>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start;
                  puVar1 = results.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                           ._M_impl.super__Vector_impl_data._M_finish,
                  pbVar19 = results.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start, puVar24 != puVar18;
                  puVar24 = puVar24 + 1) {
                score = 0;
                alignment.
                super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                alignment.
                super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
                _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
                alignment.
                super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
                _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
                spoa::AlignmentEngine::Align
                          ((Alignment *)
                           &alignment_rev.
                            super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                           ,this,&((puVar24->_M_t).
                                   super___uniq_ptr_impl<biosoup::Sequence,_std::default_delete<biosoup::Sequence>_>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_biosoup::Sequence_*,_std::default_delete<biosoup::Sequence>_>
                                   .super__Head_base<0UL,_biosoup::Sequence_*,_false>._M_head_impl)
                                  ->data,&graph,&score);
                std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::
                _M_move_assign((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *
                               )&alignment.
                                 super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                               ,&alignment_rev.
                                 super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                              );
                std::_Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::
                ~_Vector_base(&alignment_rev.
                               super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                             );
                if (bVar10) {
                  biosoup::Sequence::ReverseAndComplement
                            ((puVar24->_M_t).
                             super___uniq_ptr_impl<biosoup::Sequence,_std::default_delete<biosoup::Sequence>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_biosoup::Sequence_*,_std::default_delete<biosoup::Sequence>_>
                             .super__Head_base<0UL,_biosoup::Sequence_*,_false>._M_head_impl);
                  score_rev = 0;
                  alignment_rev.
                  super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                  alignment_rev.
                  super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
                  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
                  alignment_rev.
                  super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
                  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
                  spoa::AlignmentEngine::Align
                            ((Alignment *)&headers,this,
                             &((puVar24->_M_t).
                               super___uniq_ptr_impl<biosoup::Sequence,_std::default_delete<biosoup::Sequence>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_biosoup::Sequence_*,_std::default_delete<biosoup::Sequence>_>
                               .super__Head_base<0UL,_biosoup::Sequence_*,_false>._M_head_impl)->
                              data,&graph,&score_rev);
                  std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::
                  _M_move_assign((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                                  *)&alignment_rev.
                                     super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                                 ,(_Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                                   *)&headers);
                  std::_Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::
                  ~_Vector_base((_Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                                 *)&headers);
                  iVar9 = score_rev;
                  iVar6 = score;
                  if (score < score_rev) {
                    std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::
                    operator=((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)
                              &alignment.
                               super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                              ,(vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *
                               )&alignment_rev.
                                 super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                             );
                  }
                  else {
                    biosoup::Sequence::ReverseAndComplement
                              ((puVar24->_M_t).
                               super___uniq_ptr_impl<biosoup::Sequence,_std::default_delete<biosoup::Sequence>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_biosoup::Sequence_*,_std::default_delete<biosoup::Sequence>_>
                               .super__Head_base<0UL,_biosoup::Sequence_*,_false>._M_head_impl);
                  }
                  std::vector<bool,_std::allocator<bool>_>::push_back(&is_reversed,iVar6 < iVar9);
                  std::_Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::
                  ~_Vector_base(&alignment_rev.
                                 super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                               );
                }
                pSVar4 = (puVar24->_M_t).
                         super___uniq_ptr_impl<biosoup::Sequence,_std::default_delete<biosoup::Sequence>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_biosoup::Sequence_*,_std::default_delete<biosoup::Sequence>_>
                         .super__Head_base<0UL,_biosoup::Sequence_*,_false>._M_head_impl;
                if ((pSVar4->quality)._M_string_length == 0) {
                  spoa::Graph::AddAlignment
                            (&graph,(Alignment *)
                                    &alignment.
                                     super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                             ,&pSVar4->data,1);
                }
                else {
                  spoa::Graph::AddAlignment
                            (&graph,(Alignment *)
                                    &alignment.
                                     super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                             ,&pSVar4->data,&pSVar4->quality);
                }
                std::_Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::
                ~_Vector_base(&alignment.
                               super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                             );
              }
              for (; puVar18 = sequences.
                               super__Vector_base<std::unique_ptr<biosoup::Sequence,_std::default_delete<biosoup::Sequence>_>,_std::allocator<std::unique_ptr<biosoup::Sequence,_std::default_delete<biosoup::Sequence>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_finish, pbVar19 != puVar1;
                  pbVar19 = pbVar19 + 1) {
                bVar2 = *pbVar19;
                if (bVar2 - 1 < 2) {
                  spoa::Graph::GenerateMultipleSequenceAlignment_abi_cxx11_
                            ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              *)&alignment_rev,&graph,bVar2 == 2);
                  for (uVar23 = 0; uVar20 = (ulong)uVar23,
                      uVar20 < (ulong)((long)alignment_rev.
                                             super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                                             ._M_impl.super__Vector_impl_data._M_finish -
                                       (long)alignment_rev.
                                             super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                                             ._M_impl.super__Vector_impl_data._M_start >> 5);
                      uVar23 = uVar23 + 1) {
                    if (uVar20 < (ulong)((long)sequences.
                                               super__Vector_base<std::unique_ptr<biosoup::Sequence,_std::default_delete<biosoup::Sequence>_>,_std::allocator<std::unique_ptr<biosoup::Sequence,_std::default_delete<biosoup::Sequence>_>_>_>
                                               ._M_impl.super__Vector_impl_data._M_finish -
                                         (long)sequences.
                                               super__Vector_base<std::unique_ptr<biosoup::Sequence,_std::default_delete<biosoup::Sequence>_>,_std::allocator<std::unique_ptr<biosoup::Sequence,_std::default_delete<biosoup::Sequence>_>_>_>
                                               ._M_impl.super__Vector_impl_data._M_start >> 3)) {
                      std::__cxx11::string::string
                                ((string *)&alignment,
                                 (string *)
                                 &(sequences.
                                   super__Vector_base<std::unique_ptr<biosoup::Sequence,_std::default_delete<biosoup::Sequence>_>,_std::allocator<std::unique_ptr<biosoup::Sequence,_std::default_delete<biosoup::Sequence>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start[uVar20]._M_t.
                                   super___uniq_ptr_impl<biosoup::Sequence,_std::default_delete<biosoup::Sequence>_>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_biosoup::Sequence_*,_std::default_delete<biosoup::Sequence>_>
                                   .super__Head_base<0UL,_biosoup::Sequence_*,_false>._M_head_impl)
                                  ->name);
                    }
                    else {
                      std::__cxx11::string::string<std::allocator<char>>
                                ((string *)&alignment,"Consensus",(allocator<char> *)&headers);
                    }
                    poVar21 = std::operator<<((ostream *)&std::cout,">");
                    poVar21 = std::operator<<(poVar21,(string *)&alignment);
                    poVar21 = std::endl<char,std::char_traits<char>>(poVar21);
                    poVar21 = std::operator<<(poVar21,(string *)
                                                      (alignment_rev.
                                                                                                              
                                                  super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start +
                                                  uVar20 * 4));
                    std::endl<char,std::char_traits<char>>(poVar21);
                    std::__cxx11::string::~string((string *)&alignment);
                  }
                  this_00 = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)&alignment_rev;
LAB_001042a3:
                  std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::~vector(this_00);
                }
                else {
                  if (bVar2 - 3 < 2) {
                    headers.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                    headers.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
                    headers.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
                    for (puVar24 = sequences.
                                   super__Vector_base<std::unique_ptr<biosoup::Sequence,_std::default_delete<biosoup::Sequence>_>,_std::allocator<std::unique_ptr<biosoup::Sequence,_std::default_delete<biosoup::Sequence>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start; puVar24 != puVar18;
                        puVar24 = puVar24 + 1) {
                      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
                      emplace_back<std::__cxx11::string&>
                                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>
                                  *)&headers,
                                 &((puVar24->_M_t).
                                   super___uniq_ptr_impl<biosoup::Sequence,_std::default_delete<biosoup::Sequence>_>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_biosoup::Sequence_*,_std::default_delete<biosoup::Sequence>_>
                                   .super__Head_base<0UL,_biosoup::Sequence_*,_false>._M_head_impl)
                                  ->name);
                    }
                    spoa::Graph::GenerateConsensus_abi_cxx11_(&local_50,&graph);
                    std::__cxx11::string::~string((string *)&local_50);
                    pcVar28 = "[spoa::PrintGfa] error: missing header(s)";
                    uVar20 = (long)graph.sequences_.
                                   super__Vector_base<spoa::Graph::Node_*,_std::allocator<spoa::Graph::Node_*>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                             (long)graph.sequences_.
                                   super__Vector_base<spoa::Graph::Node_*,_std::allocator<spoa::Graph::Node_*>_>
                                   ._M_impl.super__Vector_impl_data._M_start >> 3;
                    if (((ulong)((long)headers.
                                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_finish -
                                 (long)headers.
                                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start >> 5) < uVar20) ||
                       ((bVar2 = *pbVar19,
                        is_reversed.super__Bvector_base<std::allocator<bool>_>._M_impl.
                        super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p !=
                        is_reversed.super__Bvector_base<std::allocator<bool>_>._M_impl.
                        super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p ||
                        is_reversed.super__Bvector_base<std::allocator<bool>_>._M_impl.
                        super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset != 0
                        && (pcVar28 = "[spoa::PringGfa] error: missing reversion flag(s)",
                           (ulong)is_reversed.super__Bvector_base<std::allocator<bool>_>._M_impl.
                                  super__Bvector_impl_data._M_finish.super__Bit_iterator_base.
                                  _M_offset +
                           ((long)is_reversed.super__Bvector_base<std::allocator<bool>_>._M_impl.
                                  super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p -
                           (long)is_reversed.super__Bvector_base<std::allocator<bool>_>._M_impl.
                                 super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p) *
                           8 < uVar20)))) {
                      poVar21 = std::operator<<((ostream *)&std::cerr,pcVar28);
                      std::endl<char,std::char_traits<char>>(poVar21);
                    }
                    else {
                      alignment_rev.
                      super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                      ._M_impl.super__Vector_impl_data._M_start =
                           (pointer)((ulong)alignment_rev.
                                            super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                                            ._M_impl.super__Vector_impl_data._M_start &
                                    0xffffffffffffff00);
                      std::vector<bool,_std::allocator<bool>_>::vector
                                ((vector<bool,_std::allocator<bool>_> *)&alignment,
                                 (long)graph.nodes_.
                                       super__Vector_base<std::unique_ptr<spoa::Graph::Node,_std::default_delete<spoa::Graph::Node>_>,_std::allocator<std::unique_ptr<spoa::Graph::Node,_std::default_delete<spoa::Graph::Node>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_finish -
                                 (long)graph.nodes_.
                                       super__Vector_base<std::unique_ptr<spoa::Graph::Node,_std::default_delete<spoa::Graph::Node>_>,_std::allocator<std::unique_ptr<spoa::Graph::Node,_std::default_delete<spoa::Graph::Node>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start >> 3,
                                 (bool *)&alignment_rev,(allocator_type *)&score);
                      ppNVar8 = graph.consensus_.
                                super__Vector_base<spoa::Graph::Node_*,_std::allocator<spoa::Graph::Node_*>_>
                                ._M_impl.super__Vector_impl_data._M_finish;
                      for (ppNVar25 = graph.consensus_.
                                      super__Vector_base<spoa::Graph::Node_*,_std::allocator<spoa::Graph::Node_*>_>
                                      ._M_impl.super__Vector_impl_data._M_start; ppNVar25 != ppNVar8
                          ; ppNVar25 = ppNVar25 + 1) {
                        rVar31 = std::vector<bool,_std::allocator<bool>_>::operator[]
                                           ((vector<bool,_std::allocator<bool>_> *)&alignment,
                                            (ulong)(*ppNVar25)->id);
                        *rVar31._M_p = *rVar31._M_p | rVar31._M_mask;
                      }
                      poVar21 = std::operator<<((ostream *)&std::cout,"H\tVN:Z:1.0");
                      std::endl<char,std::char_traits<char>>(poVar21);
                      puVar7 = graph.nodes_.
                               super__Vector_base<std::unique_ptr<spoa::Graph::Node,_std::default_delete<spoa::Graph::Node>_>,_std::allocator<std::unique_ptr<spoa::Graph::Node,_std::default_delete<spoa::Graph::Node>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_finish;
                      for (puVar26 = graph.nodes_.
                                     super__Vector_base<std::unique_ptr<spoa::Graph::Node,_std::default_delete<spoa::Graph::Node>_>,_std::allocator<std::unique_ptr<spoa::Graph::Node,_std::default_delete<spoa::Graph::Node>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start; puVar26 != puVar7;
                          puVar26 = puVar26 + 1) {
                        poVar21 = std::operator<<((ostream *)&std::cout,"S\t");
                        poVar21 = std::ostream::_M_insert<unsigned_long>((ulong)poVar21);
                        poVar21 = std::operator<<(poVar21,"\t");
                        std::operator<<(poVar21,(char)graph.decoder_.
                                                      super__Vector_base<int,_std::allocator<int>_>.
                                                      _M_impl.super__Vector_impl_data._M_start
                                                      [(byte)((puVar26->_M_t).
                                                                                                                            
                                                  super___uniq_ptr_impl<spoa::Graph::Node,_std::default_delete<spoa::Graph::Node>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_spoa::Graph::Node_*,_std::default_delete<spoa::Graph::Node>_>
                                                  .super__Head_base<0UL,_spoa::Graph::Node_*,_false>
                                                  ._M_head_impl)->code]);
                        rVar31 = std::vector<bool,_std::allocator<bool>_>::operator[]
                                           ((vector<bool,_std::allocator<bool>_> *)&alignment,
                                            (ulong)((puVar26->_M_t).
                                                                                                        
                                                  super___uniq_ptr_impl<spoa::Graph::Node,_std::default_delete<spoa::Graph::Node>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_spoa::Graph::Node_*,_std::default_delete<spoa::Graph::Node>_>
                                                  .super__Head_base<0UL,_spoa::Graph::Node_*,_false>
                                                  ._M_head_impl)->id);
                        if ((*rVar31._M_p & rVar31._M_mask) != 0) {
                          std::operator<<((ostream *)&std::cout,"\tic:Z:true");
                        }
                        std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
                        pNVar22 = (puVar26->_M_t).
                                  super___uniq_ptr_impl<spoa::Graph::Node,_std::default_delete<spoa::Graph::Node>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_spoa::Graph::Node_*,_std::default_delete<spoa::Graph::Node>_>
                                  .super__Head_base<0UL,_spoa::Graph::Node_*,_false>._M_head_impl;
                        ppEVar5 = (pNVar22->outedges).
                                  super__Vector_base<spoa::Graph::Edge_*,_std::allocator<spoa::Graph::Edge_*>_>
                                  ._M_impl.super__Vector_impl_data._M_finish;
                        for (ppEVar30 = *(pointer *)
                                         &(pNVar22->outedges).
                                          super__Vector_base<spoa::Graph::Edge_*,_std::allocator<spoa::Graph::Edge_*>_>
                                          ._M_impl; ppEVar30 != ppEVar5; ppEVar30 = ppEVar30 + 1) {
                          poVar21 = std::operator<<((ostream *)&std::cout,"L\t");
                          poVar21 = std::ostream::_M_insert<unsigned_long>((ulong)poVar21);
                          poVar21 = std::operator<<(poVar21,"\t");
                          poVar21 = std::operator<<(poVar21,"+\t");
                          poVar21 = std::ostream::_M_insert<unsigned_long>((ulong)poVar21);
                          poVar21 = std::operator<<(poVar21,"\t");
                          poVar21 = std::operator<<(poVar21,"+\t");
                          poVar21 = std::operator<<(poVar21,"OM\t");
                          poVar21 = std::operator<<(poVar21,"ew:f:");
                          std::ostream::_M_insert<long>((long)poVar21);
                          rVar31 = std::vector<bool,_std::allocator<bool>_>::operator[]
                                             ((vector<bool,_std::allocator<bool>_> *)&alignment,
                                              (ulong)((puVar26->_M_t).
                                                                                                            
                                                  super___uniq_ptr_impl<spoa::Graph::Node,_std::default_delete<spoa::Graph::Node>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_spoa::Graph::Node_*,_std::default_delete<spoa::Graph::Node>_>
                                                  .super__Head_base<0UL,_spoa::Graph::Node_*,_false>
                                                  ._M_head_impl)->id);
                          if (((*rVar31._M_p & rVar31._M_mask) != 0) &&
                             (rVar31 = std::vector<bool,_std::allocator<bool>_>::operator[]
                                                 ((vector<bool,_std::allocator<bool>_> *)&alignment,
                                                  (ulong)(*ppEVar30)->head->id),
                             (*rVar31._M_p & rVar31._M_mask) != 0)) {
                            std::operator<<((ostream *)&std::cout,"\tic:Z:true");
                          }
                          std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
                        }
                      }
                      for (uVar23 = 0; uVar20 = (ulong)uVar23,
                          uVar20 < (ulong)((long)graph.sequences_.
                                                 super__Vector_base<spoa::Graph::Node_*,_std::allocator<spoa::Graph::Node_*>_>
                                                 ._M_impl.super__Vector_impl_data._M_finish -
                                           (long)graph.sequences_.
                                                 super__Vector_base<spoa::Graph::Node_*,_std::allocator<spoa::Graph::Node_*>_>
                                                 ._M_impl.super__Vector_impl_data._M_start >> 3);
                          uVar23 = uVar23 + 1) {
                        poVar21 = std::operator<<((ostream *)&std::cout,"P\t");
                        poVar21 = std::operator<<(poVar21,(string *)
                                                          (headers.
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start + uVar20
                                                  ));
                        std::operator<<(poVar21,"\t");
                        alignment_rev.
                        super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                        alignment_rev.
                        super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
                        alignment_rev.
                        super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
                        pNVar22 = graph.sequences_.
                                  super__Vector_base<spoa::Graph::Node_*,_std::allocator<spoa::Graph::Node_*>_>
                                  ._M_impl.super__Vector_impl_data._M_start[uVar20];
                        do {
                          score = pNVar22->id + 1;
                          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::
                          emplace_back<unsigned_int>
                                    ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                                     &alignment_rev,(uint *)&score);
                          pNVar22 = spoa::Graph::Node::Successor(pNVar22,uVar23);
                        } while (pNVar22 != (Node *)0x0);
                        if ((is_reversed.super__Bvector_base<std::allocator<bool>_>._M_impl.
                             super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p !=
                             is_reversed.super__Bvector_base<std::allocator<bool>_>._M_impl.
                             super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p) ||
                           (pcVar28 = "+",
                           is_reversed.super__Bvector_base<std::allocator<bool>_>._M_impl.
                           super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset !=
                           0)) {
                          cVar12 = std::vector<bool,_std::allocator<bool>_>::operator[]
                                             (&is_reversed,uVar20);
                          pcVar28 = "+";
                          if (cVar12) {
                            std::
                            __reverse<__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,std::allocator<unsigned_int>>>>
                                      (alignment_rev.
                                       super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start,
                                       alignment_rev.
                                       super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                                       ._M_impl.super__Vector_impl_data._M_finish);
                            pcVar28 = "-";
                          }
                        }
                        for (uVar29 = 0;
                            (ulong)uVar29 <
                            (ulong)((long)alignment_rev.
                                          super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                                          ._M_impl.super__Vector_impl_data._M_finish -
                                    (long)alignment_rev.
                                          super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                                          ._M_impl.super__Vector_impl_data._M_start >> 2);
                            uVar29 = uVar29 + 1) {
                          if ((ulong)uVar29 != 0) {
                            std::operator<<((ostream *)&std::cout,",");
                          }
                          poVar21 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
                          std::operator<<(poVar21,pcVar28);
                        }
                        poVar21 = std::operator<<((ostream *)&std::cout,"\t*");
                        std::endl<char,std::char_traits<char>>(poVar21);
                        std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::
                        ~_Vector_base((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)
                                      &alignment_rev);
                      }
                      if (bVar2 == 4) {
                        std::operator<<((ostream *)&std::cout,"P\tConsensus\t");
                        for (uVar23 = 0;
                            (ulong)uVar23 <
                            (ulong)((long)graph.consensus_.
                                          super__Vector_base<spoa::Graph::Node_*,_std::allocator<spoa::Graph::Node_*>_>
                                          ._M_impl.super__Vector_impl_data._M_finish -
                                    (long)graph.consensus_.
                                          super__Vector_base<spoa::Graph::Node_*,_std::allocator<spoa::Graph::Node_*>_>
                                          ._M_impl.super__Vector_impl_data._M_start >> 3);
                            uVar23 = uVar23 + 1) {
                          if ((ulong)uVar23 != 0) {
                            std::operator<<((ostream *)&std::cout,",");
                          }
                          poVar21 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
                          std::operator<<(poVar21,"+");
                        }
                        poVar21 = std::operator<<((ostream *)&std::cout,"\t*");
                        std::endl<char,std::char_traits<char>>(poVar21);
                      }
                      std::_Bvector_base<std::allocator<bool>_>::~_Bvector_base
                                ((_Bvector_base<std::allocator<bool>_> *)&alignment);
                    }
                    this_00 = &headers;
                    goto LAB_001042a3;
                  }
                  if (bVar2 == 0) {
                    spoa::Graph::GenerateConsensus_abi_cxx11_((string *)&alignment,&graph,local_238)
                    ;
                    poVar21 = std::operator<<((ostream *)&std::cout,">Consensus LN:i:");
                    poVar21 = std::ostream::_M_insert<unsigned_long>((ulong)poVar21);
                    poVar21 = std::endl<char,std::char_traits<char>>(poVar21);
                    poVar21 = std::operator<<(poVar21,(string *)&alignment);
                    std::endl<char,std::char_traits<char>>(poVar21);
                    std::__cxx11::string::~string((string *)&alignment);
                  }
                }
              }
              spoa::Graph::PrintDot(&graph,&dot_path);
              iVar27 = 0;
              std::_Bvector_base<std::allocator<bool>_>::~_Bvector_base
                        (&is_reversed.super__Bvector_base<std::allocator<bool>_>);
              spoa::Graph::~Graph(&graph);
              std::
              vector<std::unique_ptr<biosoup::Sequence,_std::default_delete<biosoup::Sequence>_>,_std::allocator<std::unique_ptr<biosoup::Sequence,_std::default_delete<biosoup::Sequence>_>_>_>
              ::~vector(&sequences);
              (*this->_vptr_AlignmentEngine[1])();
              if ((_func_int **)local_2a0._0_8_ != (_func_int **)0x0) {
                (**(code **)(*(_func_int **)local_2a0._0_8_ + 8))();
              }
            }
          }
          else {
            poVar21 = std::operator<<((ostream *)&std::cerr,"[spoa::] error: missing input file!");
            std::endl<char,std::char_traits<char>>(poVar21);
            anon_unknown.dwarf_f297::Help();
          }
        }
        goto switchD_001035fe_caseD_66;
      }
      local_238 = atoi(_optarg);
      bVar11 = bVar10;
    }
  } while( true );
}

Assistant:

int main(int argc, char** argv) {
  std::int8_t m = 5;
  std::int8_t n = -4;
  std::int8_t g = -8;
  std::int8_t e = -6;
  std::int8_t q = -10;
  std::int8_t c = -4;

  std::int32_t min_coverage = -1;

  std::uint8_t algorithm = 0;
  std::vector<std::uint8_t> results = { 0 };
  std::string dot_path{};
  bool is_strand_ambiguous = false;

  std::string optstr = "m:n:g:e:q:c:l:r:d:sh";
  int opt;
  while ((opt = getopt_long(argc, argv, optstr.c_str(), options, nullptr)) != -1) {  // NOLINT
    switch (opt) {
      case 'm': m = atoi(optarg); break;
      case 'n': n = atoi(optarg); break;
      case 'g': g = atoi(optarg); break;
      case 'e': e = atoi(optarg); break;
      case 'q': q = atoi(optarg); break;
      case 'c': c = atoi(optarg); break;
      case 'M': min_coverage = atoi(optarg); break;
      case 'l': algorithm = atoi(optarg); break;
      case 'r': results.emplace_back(atoi(optarg)); break;
      case 'd': dot_path = optarg; break;
      case 's': is_strand_ambiguous = true; break;
      case 'v': std::cout << spoa::Version() << std::endl; return 0;
      case 'h': Help(); return 0;
      default: return 1;
    }
  }
  if (results.size() > 1) {
    results.erase(results.begin());
  }

  if (optind >= argc) {
    std::cerr << "[spoa::] error: missing input file!" << std::endl;
    Help();
    return 1;
  }

  auto sparser = CreateParser(argv[optind]);
  if (sparser == nullptr) {
    return 1;
  }

  std::unique_ptr<spoa::AlignmentEngine> alignment_engine;
  try {
    alignment_engine = spoa::AlignmentEngine::Create(
        static_cast<spoa::AlignmentType>(algorithm), m, n, g, e, q, c);
  } catch(std::invalid_argument& exception) {
    std::cerr << exception.what() << std::endl;
    return 1;
  }

  std::vector<std::unique_ptr<biosoup::Sequence>> sequences;
  sequences = sparser->Parse(-1);

  std::size_t max_sequence_len = 0;
  for (const auto& it : sequences) {
    max_sequence_len = std::max(max_sequence_len, it->data.size());
  }
  try {
    alignment_engine->Prealloc(max_sequence_len, 4);
  } catch (std::invalid_argument& exception) {
    std::cerr << exception.what() << std::endl;
    return 1;
  }

  spoa::Graph graph{};
  std::vector<bool> is_reversed;
  for (const auto& it : sequences) {
    std::int32_t score = 0;
    spoa::Alignment alignment;
    try {
      alignment = alignment_engine->Align(it->data, graph, &score);
    } catch (std::invalid_argument& exception) {
      std::cerr << exception.what() << std::endl;
      return 1;
    }

    if (is_strand_ambiguous) {
      it->ReverseAndComplement();
      std::int32_t score_rev = 0;
      spoa::Alignment alignment_rev;
      try {
        alignment_rev = alignment_engine->Align(it->data, graph, &score_rev);
      } catch (std::invalid_argument& exception) {
        std::cerr << exception.what() << std::endl;
        return 1;
      }
      if (score >= score_rev) {
        it->ReverseAndComplement();
        is_reversed.push_back(false);
      } else {
        alignment = alignment_rev;
        is_reversed.push_back(true);
      }
    }

    try {
      if (it->quality.empty()) {
        graph.AddAlignment(alignment, it->data);
      } else {
        graph.AddAlignment(alignment, it->data, it->quality);
      }
    } catch(std::invalid_argument& exception) {
      std::cerr << exception.what() << std::endl;
      return 1;
    }
  }

  for (const auto& it : results) {
    switch (it) {
      case 0: {
        auto consensus = graph.GenerateConsensus(min_coverage);
        std::cout << ">Consensus LN:i:" << consensus.size() << std::endl
                  << consensus << std::endl;
        break;
      }
      case 1:
      case 2: {
        auto msa = graph.GenerateMultipleSequenceAlignment(it == 2);
        for (std::uint32_t i = 0; i < msa.size(); ++i) {
          std::string name = i < sequences.size() ? sequences[i]->name : "Consensus";  // NOLINT
          std::cout << ">" << name << std::endl
                    << msa[i] << std::endl;
        }
        break;
      }
      case 3:
      case 4: {
        std::vector<std::string> headers;
        for (const auto& it : sequences) {
          headers.emplace_back(it->name);
        }
        graph.GenerateConsensus();
        PrintGfa(graph, headers, is_reversed, it == 4);
        break;
      }
      default:
        break;
    }
  }

  graph.PrintDot(dot_path);

  return 0;
}